

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgradientreconstruction.cpp
# Opt level: O2

void __thiscall
TPZGradientReconstruction::TPZGradientData::ComputeWeights(TPZGradientData *this,REAL paramk)

{
  TPZManVector<double,_3> *pTVar1;
  TPZGeoEl *pTVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  int id;
  long lVar6;
  REAL __x;
  double dVar7;
  double local_1c0;
  double local_1b8;
  TPZManVector<double,_3> centerneigh;
  TPZManVector<double,_3> nodecelX;
  TPZManVector<double,_30> dist;
  
  if ((1.0 <= paramk) && (paramk <= 2.0)) {
    TPZManVector<double,_3>::TPZManVector(&nodecelX,0);
    NodeCloserCenterX(this,&nodecelX);
    lVar5 = (this->fCelAndNeighbors).super_TPZManVector<TPZCompEl_*,_10>.super_TPZVec<TPZCompEl_*>.
            fNElements + -1;
    centerneigh.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
    TPZManVector<double,_30>::TPZManVector(&dist,lVar5,(double *)&centerneigh);
    local_1b8 = 0.0;
    TPZManVector<double,_3>::TPZManVector(&centerneigh,3,&local_1b8);
    if (lVar5 < 1) {
      lVar5 = 0;
    }
    local_1c0 = 0.0;
    lVar6 = 0;
    while( true ) {
      if (lVar6 == lVar5) {
        local_1b8 = 0.0;
        TPZManVector<double,_3>::Resize
                  (&this->fWeightsGrad,dist.super_TPZVec<double>.fNElements,&local_1b8);
        lVar5 = 0;
        while( true ) {
          if (dist.super_TPZVec<double>.fNElements <= lVar5) {
            TPZManVector<double,_3>::~TPZManVector(&centerneigh);
            TPZManVector<double,_30>::~TPZManVector(&dist);
            TPZManVector<double,_3>::~TPZManVector(&nodecelX);
            return;
          }
          dVar7 = pow(dist.super_TPZVec<double>.fStore[lVar5],paramk);
          dVar7 = (1.0 / dVar7) / local_1c0;
          (this->fWeightsGrad).super_TPZVec<double>.fStore[lVar5] = dVar7;
          if ((dVar7 < 0.0) || (1.0 < dVar7)) break;
          lVar5 = lVar5 + 1;
        }
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Post/pzgradientreconstruction.cpp"
                   ,0x459);
      }
      pTVar2 = TPZCompEl::Reference
                         ((this->fCelAndNeighbors).super_TPZManVector<TPZCompEl_*,_10>.
                          super_TPZVec<TPZCompEl_*>.fStore[lVar6 + 1]);
      if (pTVar2 == (TPZGeoEl *)0x0) break;
      pTVar1 = (this->fCenterPointCellAndNeighbors).super_TPZManVector<TPZManVector<double,_3>,_10>.
               super_TPZVec<TPZManVector<double,_3>_>.fStore;
      uVar3 = (ulong)(uint)this->fdim;
      if (this->fdim < 1) {
        uVar3 = 0;
      }
      for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        centerneigh.super_TPZVec<double>.fStore[uVar4] =
             pTVar1[lVar6 + 1].super_TPZVec<double>.fStore[uVar4];
      }
      __x = TPZGeoEl::Distance(&centerneigh.super_TPZVec<double>,&nodecelX.super_TPZVec<double>);
      dist.super_TPZVec<double>.fStore[lVar6] = __x;
      dVar7 = pow(__x,paramk);
      local_1c0 = local_1c0 + 1.0 / dVar7;
      lVar6 = lVar6 + 1;
    }
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Post/pzgradientreconstruction.cpp"
               ,0x449);
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Post/pzgradientreconstruction.cpp"
             ,0x43a);
}

Assistant:

void TPZGradientReconstruction::TPZGradientData::ComputeWeights(REAL paramk)
{
    
    if(paramk<1 || paramk>2) DebugStop();
    
    TPZManVector<REAL,3> nodecelX;
    
    //Node more closer of the cel barycenter
    NodeCloserCenterX(nodecelX);
    
    int64_t nneighs = fCelAndNeighbors.size()-1;
    TPZManVector<REAL,30> dist(nneighs,0.);
    TPZManVector<REAL,3> centerneigh(3,0.0);
    
    REAL sum=0.;
    for(int in = 0; in < nneighs; in++)
    {
        TPZGeoEl * gel = fCelAndNeighbors[in+1]->Reference();
        if(!gel) DebugStop();
        
        for(int k=0; k<fdim; k++) centerneigh[k]=fCenterPointCellAndNeighbors[in+1][k];
        
        dist[in]=gel->Distance(centerneigh, nodecelX);
        
        sum += 1./pow((REAL)dist[in],paramk);
    }
    
    fWeightsGrad.Resize(dist.size(), 0.);
    REAL temp;
    
    for (int id = 0; id<dist.size(); id++)
    {
        temp = 1./pow((REAL)dist[id],paramk);
        fWeightsGrad[id] = temp/sum;
        if(fWeightsGrad[id]<0 || fWeightsGrad[id]>1) DebugStop();
    }
}